

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommandLine.h
# Opt level: O1

void llvm::cl::applicator<llvm::cl::LocationClass<(anonymous_namespace)::HelpPrinterWrapper>>::
     opt<llvm::cl::opt<(anonymous_namespace)::HelpPrinterWrapper,true,llvm::cl::parser<bool>>>
               (LocationClass<(anonymous_namespace)::HelpPrinterWrapper> *M,
               opt<(anonymous_namespace)::HelpPrinterWrapper,_true,_llvm::cl::parser<bool>_> *O)

{
  raw_ostream *Errs;
  Twine TStack_28;
  
  if ((O->super_opt_storage<(anonymous_namespace)::HelpPrinterWrapper,_true,_true>).Location ==
      (HelpPrinterWrapper *)0x0) {
    (O->super_opt_storage<(anonymous_namespace)::HelpPrinterWrapper,_true,_true>).Location = M->Loc;
  }
  else {
    Twine::Twine(&TStack_28,"cl::location(x) specified more than once!");
    Errs = errs();
    Option::error(&O->super_Option,&TStack_28,(StringRef)ZEXT816(0),Errs);
  }
  return;
}

Assistant:

static void opt(const Mod &M, Opt &O) { M.apply(O); }